

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  ImGuiID IVar1;
  bool bVar2;
  ImGuiContext_conflict *ctx_00;
  _Bool _Var3;
  ushort uVar4;
  ImGuiDockContext *this;
  ImGuiStoragePair *pIVar5;
  ImGuiDockNode *pIVar6;
  ImGuiDockNode **ppIVar7;
  bool bVar8;
  int local_90;
  ImGuiDockNode *local_88;
  int local_7c;
  int local_78;
  int n_2;
  int n_1;
  ImGuiID window_settings_dock_id;
  ImGuiWindowSettings *settings;
  _Bool want_removal;
  ImGuiDockNode *local_58;
  ImGuiDockNode *node;
  undefined1 local_48 [4];
  int n;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  ImGuiDataAuthority backup_root_node_authority_for_size;
  ImGuiDataAuthority backup_root_node_authority_for_pos;
  _Bool has_central_node;
  ImGuiDockNode *root_node;
  ImGuiDockContext *dc;
  ImGuiContext_conflict *ctx;
  ImGuiID root_id_local;
  
  ctx_00 = GImGui;
  this = &GImGui->DockContext;
  if (root_id == 0) {
    local_88 = (ImGuiDockNode *)0x0;
  }
  else {
    local_88 = DockContextFindNodeByID(GImGui,root_id);
    if (local_88 == (ImGuiDockNode *)0x0) {
      return;
    }
  }
  bVar2 = false;
  if (local_88 == (ImGuiDockNode *)0x0) {
    uVar4 = 0;
    local_90 = 0;
  }
  else {
    uVar4 = (short)(*(short *)&local_88->field_0xbc << 0xd) >> 0xd;
    local_90 = (int)((short)(*(short *)&local_88->field_0xbc << 10) >> 0xd);
  }
  nodes_to_remove.Data._4_4_ = local_90;
  ImVector<ImGuiDockNode_*>::ImVector((ImVector<ImGuiDockNode_*> *)local_48);
  for (node._4_4_ = 0; node._4_4_ < (this->Nodes).Data.Size; node._4_4_ = node._4_4_ + 1) {
    pIVar5 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this,node._4_4_);
    local_58 = (ImGuiDockNode *)(pIVar5->field_1).val_p;
    if (local_58 != (ImGuiDockNode *)0x0) {
      bVar8 = true;
      if ((root_id != 0) && (bVar8 = false, local_58->ID != root_id)) {
        pIVar6 = DockNodeGetRootNode(local_58);
        bVar8 = pIVar6->ID == root_id;
      }
      if (bVar8) {
        _Var3 = ImGuiDockNode::IsCentralNode(local_58);
        if (_Var3) {
          bVar2 = true;
        }
        if (root_id != 0) {
          DockContextQueueNotifyRemovedNode(ctx_00,local_58);
        }
        if (local_88 != (ImGuiDockNode *)0x0) {
          DockNodeMoveWindows(local_88,local_58);
          DockSettingsRenameNodeReferences(local_58->ID,local_88->ID);
        }
        ImVector<ImGuiDockNode_*>::push_back((ImVector<ImGuiDockNode_*> *)local_48,&local_58);
      }
    }
  }
  if (local_88 != (ImGuiDockNode *)0x0) {
    *(ushort *)&local_88->field_0xbc = *(ushort *)&local_88->field_0xbc & 0xfff8 | uVar4 & 7;
    *(ushort *)&local_88->field_0xbc =
         *(ushort *)&local_88->field_0xbc & 0xffc7 | ((ushort)nodes_to_remove.Data._4_4_ & 7) << 3;
  }
  _n_1 = ImChunkStream<ImGuiWindowSettings>::begin(&ctx_00->SettingsWindows);
  do {
    if (_n_1 == (ImGuiWindowSettings *)0x0) {
      if (1 < (int)local_48) {
        qsort((void *)nodes_to_remove._0_8_,(long)(int)local_48,8,DockNodeComparerDepthMostFirst);
      }
      for (local_7c = 0; local_7c < (int)local_48; local_7c = local_7c + 1) {
        ppIVar7 = ImVector<ImGuiDockNode_*>::operator[]
                            ((ImVector<ImGuiDockNode_*> *)local_48,local_7c);
        DockContextRemoveNode(ctx_00,*ppIVar7,false);
      }
      if (root_id == 0) {
        ImGuiStorage::Clear(&this->Nodes);
        ImVector<ImGuiDockRequest>::clear(&(ctx_00->DockContext).Requests);
      }
      else if (bVar2) {
        local_88->CentralNode = local_88;
        ImGuiDockNode::SetLocalFlags(local_88,local_88->LocalFlags | 0x800);
      }
      ImVector<ImGuiDockNode_*>::~ImVector((ImVector<ImGuiDockNode_*> *)local_48);
      return;
    }
    IVar1 = _n_1->DockId;
    if (IVar1 != 0) {
      for (local_78 = 0; local_78 < (int)local_48; local_78 = local_78 + 1) {
        ppIVar7 = ImVector<ImGuiDockNode_*>::operator[]
                            ((ImVector<ImGuiDockNode_*> *)local_48,local_78);
        if ((*ppIVar7)->ID == IVar1) {
          _n_1->DockId = root_id;
          break;
        }
      }
    }
    _n_1 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx_00->SettingsWindows,_n_1);
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                {
                    DockNodeMoveWindows(root_node, node);
                    DockSettingsRenameNodeReferences(node->ID, root_node->ID);
                }
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->CentralNode = root_node;
        root_node->SetLocalFlags(root_node->LocalFlags | ImGuiDockNodeFlags_CentralNode);
    }
}